

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O3

void __thiscall
SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>::Reverse
          (SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *this)

{
  SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *pSVar1;
  SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *addr;
  SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *pSVar2;
  
  pSVar1 = (SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)
           (this->super_SListNodeBase<Memory::Recycler>).next.ptr;
  pSVar2 = this;
  while (addr = pSVar1, addr != this) {
    pSVar1 = (SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)
             (addr->super_SListNodeBase<Memory::Recycler>).next.ptr;
    Memory::Recycler::WBSetBit((char *)addr);
    (addr->super_SListNodeBase<Memory::Recycler>).next.ptr =
         &pSVar2->super_SListNodeBase<Memory::Recycler>;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    pSVar2 = addr;
  }
  Memory::Recycler::WBSetBit((char *)addr);
  (addr->super_SListNodeBase<Memory::Recycler>).next.ptr =
       &pSVar2->super_SListNodeBase<Memory::Recycler>;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void Reverse()
    {
        NodeBase * prev = this;
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            current->Next() = prev;
            prev = current;
            current = next;
        }
        current->Next() = prev;
    }